

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void __thiscall Tester::compileFile(Tester *this,string *filename,Report *report)

{
  FILE *__s;
  basic_istream<char,_std::char_traits<char>_> *this_00;
  basic_string_view<char> format_str;
  initializer_list<flow::lang::Feature> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_> unit;
  unique_ptr<flow::Program,_std::default_delete<flow::Program>_> program;
  shared_ptr<flow::IRProgram> programIR;
  PassManager pm;
  Parser parser;
  IRGenerator irgen;
  long *local_690;
  undefined1 local_688 [8];
  IRProgram *local_680;
  _Base_ptr local_678;
  undefined1 local_670 [32];
  undefined1 local_650 [32];
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_590;
  HandlerPass local_578;
  HandlerPass local_558;
  HandlerPass local_538;
  HandlerPass local_518;
  HandlerPass local_4f8;
  HandlerPass local_4d8;
  HandlerPass local_4b8;
  _Any_data local_498;
  pointer local_488;
  code *pcStack_480;
  _Rb_tree<flow::lang::Feature,_flow::lang::Feature,_std::_Identity<flow::lang::Feature>,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>
  local_470;
  undefined1 local_440 [32];
  IRProgram local_420;
  Parser local_188;
  IRGenerator local_118;
  
  __s = _stdout;
  local_118.super_ASTVisitor._vptr_ASTVisitor = (_func_int **)(filename->_M_dataplus)._M_p;
  local_118.super_IRBuilder.program_ = (IRProgram *)filename->_M_string_length;
  local_440._16_8_ = 0;
  local_440._0_8_ = &PTR_grow_001aeda8;
  local_440._24_8_ = 500;
  format_str.size_ = 0xb;
  format_str.data_ = "testing {}\n";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_118;
  args.types_ = 0xb;
  local_440._8_8_ = &local_420;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_440,format_str,args);
  fwrite((void *)local_440._8_8_,1,local_440._16_8_,__s);
  local_440._0_8_ = &PTR_grow_001aeda8;
  if ((IRProgram *)local_440._8_8_ != &local_420) {
    operator_delete((void *)local_440._8_8_,local_440._24_8_);
  }
  local_440._0_8_ =
       (__uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        )0x200000000;
  __l._M_len = 2;
  __l._M_array = (iterator)local_440;
  std::
  set<flow::lang::Feature,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>::
  set((set<flow::lang::Feature,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>
       *)&local_470,__l,(less<flow::lang::Feature> *)&local_118,(allocator_type *)&local_680);
  local_498._8_8_ = 0;
  pcStack_480 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/fltest/main.cc:198:29)>
                ::_M_invoke;
  local_488 = (pointer)std::
                       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/fltest/main.cc:198:29)>
                       ::_M_manager;
  local_498._M_unused._M_object = this;
  flow::lang::Parser::Parser
            (&local_188,
             (set<flow::lang::Feature,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>
              *)&local_470,report,&this->super_Runtime,(ImportHandler *)&local_498);
  if (local_488 != (pointer)0x0) {
    (*(code *)local_488)(&local_498,&local_498,3);
  }
  std::
  _Rb_tree<flow::lang::Feature,_flow::lang::Feature,_std::_Identity<flow::lang::Feature>,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>
  ::~_Rb_tree(&local_470);
  this_00 = (basic_istream<char,_std::char_traits<char>_> *)operator_new(0x208);
  std::ifstream::ifstream(this_00,(string *)filename,_S_in);
  local_440._0_8_ = this_00;
  flow::lang::Parser::openStream
            (&local_188,
             (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              *)local_440,filename);
  if ((basic_istream<char,_std::char_traits<char>_> *)local_440._0_8_ !=
      (basic_istream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)local_440._0_8_ + 8))();
  }
  flow::lang::Parser::parse((Parser *)&local_690);
  local_440._0_8_ = (long)local_440 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"main","");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_440;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_590,__l_00,(allocator_type *)&local_680);
  flow::lang::IRGenerator::IRGenerator(&local_118,report,&local_590);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_590);
  if (local_440._0_8_ != (long)local_440 + 0x10) {
    operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
  }
  flow::lang::IRGenerator::generate((IRGenerator *)local_440,(UnitSym *)&local_118);
  std::__shared_ptr<flow::IRProgram,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flow::IRProgram,std::default_delete<flow::IRProgram>,void>
            ((__shared_ptr<flow::IRProgram,(__gnu_cxx::_Lock_policy)2> *)&local_680,
             (unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)local_440);
  std::unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::~unique_ptr
            ((unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)local_440);
  local_440._16_8_ = 0;
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  local_440._0_8_ = (IRProgram *)local_440;
  local_440._8_8_ = (IRProgram *)local_440;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"eliminate-empty-blocks","");
  local_4b8.super__Function_base._M_functor._8_8_ = 0;
  local_4b8.super__Function_base._M_functor._M_unused._M_object =
       flow::transform::emptyBlockElimination;
  local_4b8._M_invoker =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
  local_4b8.super__Function_base._M_manager =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager;
  flow::PassManager::registerPass((PassManager *)local_440,&local_5b0,&local_4b8);
  if ((pointer)local_4b8.super__Function_base._M_manager != (pointer)0x0) {
    (*local_4b8.super__Function_base._M_manager)(&local_4b8,&local_4b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"eliminate-linear-br","");
  local_4d8.super__Function_base._M_functor._8_8_ = 0;
  local_4d8.super__Function_base._M_functor._M_unused._M_object = flow::transform::eliminateLinearBr
  ;
  local_4d8._M_invoker =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
  local_4d8.super__Function_base._M_manager =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager;
  flow::PassManager::registerPass((PassManager *)local_440,&local_5d0,&local_4d8);
  if ((pointer)local_4d8.super__Function_base._M_manager != (pointer)0x0) {
    (*local_4d8.super__Function_base._M_manager)(&local_4d8,&local_4d8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"eliminate-unused-blocks","")
  ;
  local_4f8.super__Function_base._M_functor._8_8_ = 0;
  local_4f8.super__Function_base._M_functor._M_unused._M_object =
       flow::transform::eliminateUnusedBlocks;
  local_4f8._M_invoker =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
  local_4f8.super__Function_base._M_manager =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager;
  flow::PassManager::registerPass((PassManager *)local_440,&local_5f0,&local_4f8);
  if ((pointer)local_4f8.super__Function_base._M_manager != (pointer)0x0) {
    (*local_4f8.super__Function_base._M_manager)(&local_4f8,&local_4f8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"eliminate-unused-instr","");
  local_518.super__Function_base._M_functor._8_8_ = 0;
  local_518.super__Function_base._M_functor._M_unused._M_object =
       flow::transform::eliminateUnusedInstr;
  local_518._M_invoker =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
  local_518.super__Function_base._M_manager =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager;
  flow::PassManager::registerPass((PassManager *)local_440,&local_610,&local_518);
  if ((pointer)local_518.super__Function_base._M_manager != (pointer)0x0) {
    (*local_518.super__Function_base._M_manager)(&local_518,&local_518,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"fold-constant-condbr","");
  local_538.super__Function_base._M_functor._8_8_ = 0;
  local_538.super__Function_base._M_functor._M_unused._M_object =
       flow::transform::foldConstantCondBr;
  local_538._M_invoker =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
  local_538.super__Function_base._M_manager =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager;
  flow::PassManager::registerPass((PassManager *)local_440,&local_630,&local_538);
  if ((_Map_pointer)local_538.super__Function_base._M_manager != (_Map_pointer)0x0) {
    (*local_538.super__Function_base._M_manager)(&local_538,&local_538,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  }
  local_650._0_8_ = (Runtime *)(local_650 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_650,"rewrite-br-to-exit","");
  local_558.super__Function_base._M_functor._8_8_ = 0;
  local_558.super__Function_base._M_functor._M_unused._M_object = flow::transform::rewriteBrToExit;
  local_558._M_invoker =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
  local_558.super__Function_base._M_manager =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager;
  flow::PassManager::registerPass((PassManager *)local_440,(string *)local_650,&local_558);
  if ((_Map_pointer)local_558.super__Function_base._M_manager != (_Map_pointer)0x0) {
    (*local_558.super__Function_base._M_manager)(&local_558,&local_558,3);
  }
  if ((Runtime *)local_650._0_8_ != (Runtime *)(local_650 + 0x10)) {
    operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
  }
  local_670._0_8_ = (_Base_ptr)(local_670 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_670,"rewrite-cond-br-to-same-branches","");
  local_578.super__Function_base._M_functor._8_8_ = 0;
  local_578.super__Function_base._M_functor._M_unused._M_object =
       flow::transform::rewriteCondBrToSameBranches;
  local_578._M_invoker =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_invoke;
  local_578.super__Function_base._M_manager =
       std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::_M_manager;
  flow::PassManager::registerPass((PassManager *)local_440,(string *)local_670,&local_578);
  if (local_578.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_578.super__Function_base._M_manager)
              ((_Any_data *)&local_578,(_Any_data *)&local_578,__destroy_functor);
  }
  if ((_Base_ptr)local_670._0_8_ != (_Base_ptr)(local_670 + 0x10)) {
    operator_delete((void *)local_670._0_8_,(ulong)(local_670._16_8_ + 1));
  }
  flow::PassManager::run((PassManager *)local_440,local_680);
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
  ::_M_clear((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
              *)local_440);
  flow::TargetCodeGenerator::TargetCodeGenerator((TargetCodeGenerator *)local_440);
  flow::TargetCodeGenerator::generate((TargetCodeGenerator *)local_688,(IRProgram *)local_440);
  flow::TargetCodeGenerator::~TargetCodeGenerator((TargetCodeGenerator *)local_440);
  flow::Program::link((Program *)local_688,(char *)this,(char *)report);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  std::unique_ptr<flow::Program,_std::default_delete<flow::Program>_>::~unique_ptr
            ((unique_ptr<flow::Program,_std::default_delete<flow::Program>_> *)local_688);
  if (local_678 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_678);
  }
  local_118.super_ASTVisitor._vptr_ASTVisitor = (_func_int **)&PTR__IRGenerator_001af048;
  std::_Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::
  ~_Deque_base(&local_118.handlerStack_.
                super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
              );
  if ((_Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
       )local_118.scope_._M_t.
        super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
        ._M_t.
        super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
        .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>._M_head_impl != (Scope *)0x0
     ) {
    std::
    _Hashtable<flow::lang::Symbol_*,_std::pair<flow::lang::Symbol_*const,_std::__cxx11::list<flow::Value_*,_std::allocator<flow::Value_*>_>_>,_std::allocator<std::pair<flow::lang::Symbol_*const,_std::__cxx11::list<flow::Value_*,_std::allocator<flow::Value_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<flow::lang::Symbol_*>,_std::hash<flow::lang::Symbol_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<flow::lang::Symbol_*,_std::pair<flow::lang::Symbol_*const,_std::__cxx11::list<flow::Value_*,_std::allocator<flow::Value_*>_>_>,_std::allocator<std::pair<flow::lang::Symbol_*const,_std::__cxx11::list<flow::Value_*,_std::allocator<flow::Value_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<flow::lang::Symbol_*>,_std::hash<flow::lang::Symbol_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)local_118.scope_._M_t.
                            super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                            .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>.
                            _M_head_impl + 0x38));
    std::
    _Hashtable<flow::lang::Symbol_*,_std::pair<flow::lang::Symbol_*const,_flow::Value_*>,_std::allocator<std::pair<flow::lang::Symbol_*const,_flow::Value_*>_>,_std::__detail::_Select1st,_std::equal_to<flow::lang::Symbol_*>,_std::hash<flow::lang::Symbol_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<flow::lang::Symbol_*,_std::pair<flow::lang::Symbol_*const,_flow::Value_*>,_std::allocator<std::pair<flow::lang::Symbol_*const,_flow::Value_*>_>,_std::__detail::_Select1st,_std::equal_to<flow::lang::Symbol_*>,_std::hash<flow::lang::Symbol_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_118.scope_._M_t.
                     super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                     .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>._M_head_impl);
    operator_delete((void *)local_118.scope_._M_t.
                            super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                            .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>.
                            _M_head_impl,0x70);
  }
  local_118.scope_._M_t.
  super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
  ._M_t.
  super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
  .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>._M_head_impl =
       (__uniq_ptr_data<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>,_true,_true>
        )(__uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
          )0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118.exports_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_118.super_IRBuilder.nameStore_._M_h);
  if (local_690 != (long *)0x0) {
    (**(code **)(*local_690 + 8))();
  }
  flow::lang::Parser::~Parser(&local_188);
  return;
}

Assistant:

void Tester::compileFile(const std::string& filename, flow::diagnostics::Report* report) {
  fmt::print("testing {}\n", filename);

  constexpr bool optimize = true;
  flow::lang::Parser parser{{flow::lang::Feature::GlobalScope, flow::lang::Feature::WhileLoop},
                            report,
                            this,
                            [this](auto x, auto y, auto z) { return import(x, y, z); }};
  parser.openStream(std::make_unique<std::ifstream>(filename), filename);
  std::unique_ptr<flow::lang::UnitSym> unit = parser.parse();

  flow::lang::IRGenerator irgen(report, {"main"});
  std::shared_ptr<flow::IRProgram> programIR = irgen.generate(unit.get());

  if (optimize) {
    flow::PassManager pm;

    pm.registerPass("eliminate-empty-blocks", &flow::transform::emptyBlockElimination);
    pm.registerPass("eliminate-linear-br", &flow::transform::eliminateLinearBr);
    pm.registerPass("eliminate-unused-blocks", &flow::transform::eliminateUnusedBlocks);
    pm.registerPass("eliminate-unused-instr", &flow::transform::eliminateUnusedInstr);
    pm.registerPass("fold-constant-condbr", &flow::transform::foldConstantCondBr);
    pm.registerPass("rewrite-br-to-exit", &flow::transform::rewriteBrToExit);
    pm.registerPass("rewrite-cond-br-to-same-branches", &flow::transform::rewriteCondBrToSameBranches);

    pm.run(programIR.get());
  }

  std::unique_ptr<flow::Program> program = flow::TargetCodeGenerator().generate(programIR.get());

  program->link(this, report);

  // TODO: execute to check expected output against `output_`
  output_.clear();
}